

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

ssize_t __thiscall
httplib::ClientImpl::send(ClientImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  mutex *__mutex;
  Socket *pSVar1;
  size_t *psVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int *piVar7;
  pthread_t pVar8;
  pthread_t pVar9;
  undefined4 in_register_00000034;
  bool close_connection;
  undefined8 *local_e8;
  undefined8 uStack_e0;
  code *local_d8;
  code *pcStack_d0;
  timeval local_c8;
  fd_set local_b8;
  
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->request_mutex_);
  if (iVar4 == 0) {
    __mutex = &this->socket_mutex_;
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar4 != 0) goto LAB_0010ed76;
    this->socket_should_be_closed_when_request_is_done_ = false;
    pSVar1 = &this->socket_;
    iVar4 = (this->socket_).sock;
    if (iVar4 == -1) {
LAB_0010eb75:
      iVar4 = (*this->_vptr_ClientImpl[3])(this,pSVar1,__n);
      if ((char)iVar4 == '\0') {
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        uVar6 = 0;
        goto LAB_0010ed53;
      }
    }
    else if (iVar4 < 0x400) {
      local_b8.fds_bits[0xe] = 0;
      local_b8.fds_bits[0xf] = 0;
      local_b8.fds_bits[0xc] = 0;
      local_b8.fds_bits[0xd] = 0;
      local_b8.fds_bits[10] = 0;
      local_b8.fds_bits[0xb] = 0;
      local_b8.fds_bits[8] = 0;
      local_b8.fds_bits[9] = 0;
      local_b8.fds_bits[6] = 0;
      local_b8.fds_bits[7] = 0;
      local_b8.fds_bits[4] = 0;
      local_b8.fds_bits[5] = 0;
      local_b8.fds_bits[2] = 0;
      local_b8.fds_bits[3] = 0;
      local_b8.fds_bits[0] = 0;
      local_b8.fds_bits[1] = 0;
      iVar5 = iVar4 + 0x3f;
      if (-1 < iVar4) {
        iVar5 = iVar4;
      }
      local_b8.fds_bits[iVar5 >> 6] =
           local_b8.fds_bits[iVar5 >> 6] | 1L << ((byte)(iVar4 % 0x40) & 0x3f);
      local_c8.tv_sec = 0;
      local_c8.tv_usec = 0;
      do {
        iVar5 = select(iVar4 + 1,(fd_set *)0x0,&local_b8,(fd_set *)0x0,&local_c8);
        if (-1 < iVar5) {
          if (iVar5 != 0) goto LAB_0010eb8f;
          break;
        }
        piVar7 = __errno_location();
      } while (*piVar7 == 4);
      (*this->_vptr_ClientImpl[4])(this,pSVar1,0);
      if (pSVar1->sock != -1) {
        shutdown(pSVar1->sock,2);
      }
      if ((this->socket_requests_in_flight_ != 0) &&
         (pVar9 = (this->socket_requests_are_from_thread_)._M_thread, pVar8 = pthread_self(),
         pVar9 != pVar8)) goto LAB_0010ed8c;
      if (pSVar1->sock != -1) {
        close(pSVar1->sock);
        pSVar1->sock = -1;
      }
      goto LAB_0010eb75;
    }
LAB_0010eb8f:
    uVar3 = this->socket_requests_in_flight_;
    if (uVar3 < 2) {
      pVar9 = pthread_self();
    }
    else {
      pVar8 = (this->socket_requests_are_from_thread_)._M_thread;
      pVar9 = pthread_self();
      if (pVar8 != pVar9) {
        __assert_fail("socket_requests_are_from_thread_ == std::this_thread::get_id()",
                      "/workspace/llm4binary/github/license_c_cmakelists/junaidrahim[P]locate-route/src/../include/httplib.h"
                      ,0x14b7,"bool httplib::ClientImpl::send(const Request &, Response &, Error &)"
                     );
      }
    }
    this->socket_requests_in_flight_ = uVar3 + 1;
    (this->socket_requests_are_from_thread_)._M_thread = pVar9;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    local_b8.fds_bits[0] = CONCAT71(local_b8.fds_bits[0]._1_7_,this->keep_alive_) ^ 1;
    local_e8 = (undefined8 *)0x0;
    uStack_e0 = 0;
    local_d8 = (code *)0x0;
    pcStack_d0 = (code *)0x0;
    local_e8 = (undefined8 *)operator_new(0x28);
    *local_e8 = this;
    local_e8[1] = CONCAT44(in_register_00000034,__fd);
    local_e8[2] = __buf;
    local_e8[3] = &local_b8;
    local_e8[4] = __n;
    pcStack_d0 = std::
                 _Function_handler<bool_(httplib::Stream_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/junaidrahim[P]locate-route/src/../include/httplib.h:5310:38)>
                 ::_M_invoke;
    local_d8 = std::
               _Function_handler<bool_(httplib::Stream_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/junaidrahim[P]locate-route/src/../include/httplib.h:5310:38)>
               ::_M_manager;
    uVar6 = (*this->_vptr_ClientImpl[5])(this,pSVar1);
    if (local_d8 != (code *)0x0) {
      (*local_d8)(&local_e8,&local_e8,3);
    }
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar4 == 0) {
      psVar2 = &this->socket_requests_in_flight_;
      *psVar2 = *psVar2 - 1;
      if (*psVar2 == 0) {
        (this->socket_requests_are_from_thread_)._M_thread = 0;
      }
      if (((this->socket_should_be_closed_when_request_is_done_ != false) || ((char)uVar6 == '\0'))
         || ((char)local_b8.fds_bits[0] != '\0')) {
        (*this->_vptr_ClientImpl[4])(this,pSVar1,1);
        if (pSVar1->sock != -1) {
          shutdown(pSVar1->sock,2);
        }
        if ((this->socket_requests_in_flight_ != 0) &&
           ((this->socket_requests_are_from_thread_)._M_thread != pVar9)) goto LAB_0010ed8c;
        if (pSVar1->sock != -1) {
          close(pSVar1->sock);
          pSVar1->sock = -1;
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      if (*(int *)__n == 0 && (char)uVar6 == '\0') {
        *(undefined4 *)__n = 1;
      }
LAB_0010ed53:
      pthread_mutex_unlock((pthread_mutex_t *)&this->request_mutex_);
      return (ulong)uVar6;
    }
  }
  else {
    iVar4 = std::__throw_system_error(iVar4);
LAB_0010ed76:
    iVar4 = std::__throw_system_error(iVar4);
  }
  std::__throw_system_error(iVar4);
LAB_0010ed8c:
  __assert_fail("socket_requests_in_flight_ == 0 || socket_requests_are_from_thread_ == std::this_thread::get_id()"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/junaidrahim[P]locate-route/src/../include/httplib.h"
                ,0x1456,"void httplib::ClientImpl::close_socket(Socket &)");
}

Assistant:

inline bool ClientImpl::send(const Request &req, Response &res, Error &error) {
		std::lock_guard<std::recursive_mutex> request_mutex_guard(request_mutex_);

		{
			std::lock_guard<std::mutex> guard(socket_mutex_);
			// Set this to false immediately - if it ever gets set to true by the end of
			// the request, we know another thread instructed us to close the socket.
			socket_should_be_closed_when_request_is_done_ = false;

			auto is_alive = false;
			if (socket_.is_open()) {
				is_alive = detail::select_write(socket_.sock, 0, 0) > 0;
				if (!is_alive) {
					// Attempt to avoid sigpipe by shutting down nongracefully if it seems
					// like the other side has already closed the connection Also, there
					// cannot be any requests in flight from other threads since we locked
					// request_mutex_, so safe to close everything immediately
					const bool shutdown_gracefully = false;
					shutdown_ssl(socket_, shutdown_gracefully);
					shutdown_socket(socket_);
					close_socket(socket_);
				}
			}

			if (!is_alive) {
				if (!create_and_connect_socket(socket_, error)) { return false; }

#ifdef CPPHTTPLIB_OPENSSL_SUPPORT
				// TODO: refactoring
      if (is_ssl()) {
        auto &scli = static_cast<SSLClient &>(*this);
        if (!proxy_host_.empty() && proxy_port_ != -1) {
          bool success = false;
          if (!scli.connect_with_proxy(socket_, res, success, error)) {
            return success;
          }
        }

        if (!scli.initialize_ssl(socket_, error)) { return false; }
      }
#endif
			}

			// Mark the current socket as being in use so that it cannot be closed by
			// anyone else while this request is ongoing, even though we will be
			// releasing the mutex.
			if (socket_requests_in_flight_ > 1) {
				assert(socket_requests_are_from_thread_ == std::this_thread::get_id());
			}
			socket_requests_in_flight_ += 1;
			socket_requests_are_from_thread_ = std::this_thread::get_id();
		}

		auto close_connection = !keep_alive_;
		auto ret = process_socket(socket_, [&](Stream &strm) {
			return handle_request(strm, req, res, close_connection, error);
		});

		// Briefly lock mutex in order to mark that a request is no longer ongoing
		{
			std::lock_guard<std::mutex> guard(socket_mutex_);
			socket_requests_in_flight_ -= 1;
			if (socket_requests_in_flight_ <= 0) {
				assert(socket_requests_in_flight_ == 0);
				socket_requests_are_from_thread_ = std::thread::id();
			}

			if (socket_should_be_closed_when_request_is_done_ || close_connection ||
				!ret) {
				shutdown_ssl(socket_, true);
				shutdown_socket(socket_);
				close_socket(socket_);
			}
		}

		if (!ret) {
			if (error == Error::Success) { error = Error::Unknown; }
		}

		return ret;
	}